

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_0::ConvertToDynamicMessageAndStripOptions
               (Message *m,DescriptorPool *pool,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *stripped_paths)

{
  bool bVar1;
  Descriptor *type;
  DescriptorPool *pDVar2;
  Message *pMVar3;
  LogMessage *pLVar4;
  MessageLite *pMVar5;
  type m_00;
  bool local_1f1;
  bool local_1d2;
  bool local_1b9;
  bool local_199;
  LogMessage local_158;
  uint32_t local_148;
  byte local_141;
  uint32_t COUNTER_3;
  bool absl_log_internal_stateful_condition_do_log_3;
  char *local_138;
  LogMessage local_128;
  uint32_t local_118;
  byte local_112;
  uint32_t COUNTER_2;
  bool absl_log_internal_stateful_condition_do_log_2;
  uint32_t local_100;
  byte local_f9;
  uint32_t COUNTER_1;
  bool absl_log_internal_stateful_condition_do_log_1;
  char *local_f0;
  int local_e8;
  LogMessage local_e0;
  uint32_t local_d0;
  byte local_c9;
  uint32_t COUNTER;
  bool absl_log_internal_stateful_condition_do_log;
  string serialized;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_message;
  DynamicMessageFactory factory;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> path;
  Descriptor *descriptor;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *stripped_paths_local;
  DescriptorPool *pool_local;
  Message *m_local;
  
  join_0x00000010_0x00000000_ = MessageLite::GetTypeName(&m->super_MessageLite);
  type = DescriptorPool::FindMessageTypeByName(pool,join_0x00000010_0x00000000_);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  if ((type == (Descriptor *)0x0) || (pDVar2 = DescriptorPool::generated_pool(), pool == pDVar2)) {
    StripMessage(m,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
  }
  else {
    DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
    pMVar3 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&dynamic_message,type);
    pMVar3 = Message::New(pMVar3);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)(serialized.field_2._M_local_buf + 8),pMVar3);
    std::__cxx11::string::string((string *)&COUNTER);
    bVar1 = MessageLite::SerializePartialToString(&m->super_MessageLite,(string *)&COUNTER);
    if (bVar1) {
      pMVar5 = &std::
                unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                              *)((long)&serialized.field_2 + 8))->super_MessageLite;
      _COUNTER_1 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&COUNTER);
      bVar1 = MessageLite::ParsePartialFromString(pMVar5,_COUNTER_1);
      if (bVar1) {
        m_00 = std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                            *)((long)&serialized.field_2 + 8));
        StripMessage(m_00,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
        pMVar5 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&serialized.field_2 + 8))->super_MessageLite;
        bVar1 = MessageLite::SerializePartialToString(pMVar5,(string *)&COUNTER);
        if (bVar1) {
          _COUNTER_3 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&COUNTER);
          bVar1 = MessageLite::ParsePartialFromString(&m->super_MessageLite,_COUNTER_3);
          if (bVar1) {
            local_e8 = 0;
          }
          else {
            local_141 = 1;
            while (local_141 != 0) {
              while( true ) {
                local_1f1 = false;
                if (local_141 != 0) {
                  local_1f1 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                                        (&(anonymous_namespace)::
                                          ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                          ::absl_log_internal_stateful_condition_state,1.0);
                }
                if (local_1f1 == false) break;
                local_148 = absl::lts_20250127::log_internal::LogEveryNSecState::counter
                                      (&(anonymous_namespace)::
                                        ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                        ::absl_log_internal_stateful_condition_state);
                while ((local_141 & 1) != 0) {
                  absl::lts_20250127::log_internal::LogMessage::LogMessage
                            (&local_158,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                             ,0x8c);
                  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_158);
                  absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar4,(char (*) [47])"Failed to fully strip source-retention options")
                  ;
                  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_158);
                  local_141 = 0;
                }
                local_141 = 0;
              }
              local_141 = 0;
            }
            StripMessage(m,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
            local_e8 = 1;
          }
        }
        else {
          local_112 = 1;
          while (local_112 != 0) {
            while( true ) {
              local_1d2 = false;
              if (local_112 != 0) {
                local_1d2 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                                      (&(anonymous_namespace)::
                                        ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                        ::absl_log_internal_stateful_condition_state,1.0);
              }
              if (local_1d2 == false) break;
              local_118 = absl::lts_20250127::log_internal::LogEveryNSecState::counter
                                    (&(anonymous_namespace)::
                                      ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                      ::absl_log_internal_stateful_condition_state);
              while ((local_112 & 1) != 0) {
                absl::lts_20250127::log_internal::LogMessage::LogMessage
                          (&local_128,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                           ,0x86);
                pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_128);
                absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar4,(char (*) [47])"Failed to fully strip source-retention options");
                absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_128);
                local_112 = 0;
              }
              local_112 = 0;
            }
            local_112 = 0;
          }
          StripMessage(m,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
          local_e8 = 1;
        }
      }
      else {
        local_f9 = 1;
        while (local_f9 != 0) {
          while( true ) {
            local_1b9 = false;
            if (local_f9 != 0) {
              local_1b9 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                                    (&(anonymous_namespace)::
                                      ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                      ::absl_log_internal_stateful_condition_state,1.0);
            }
            if (local_1b9 == false) break;
            local_100 = absl::lts_20250127::log_internal::LogEveryNSecState::counter
                                  (&(anonymous_namespace)::
                                    ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                                    ::absl_log_internal_stateful_condition_state);
            while ((local_f9 & 1) != 0) {
              absl::lts_20250127::log_internal::LogMessage::LogMessage
                        ((LogMessage *)&COUNTER_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                         ,0x7f);
              pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                 ((LogMessage *)&COUNTER_2);
              absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar4,(char (*) [47])"Failed to fully strip source-retention options");
              absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&COUNTER_2);
              local_f9 = 0;
            }
            local_f9 = 0;
          }
          local_f9 = 0;
        }
        StripMessage(m,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
        local_e8 = 1;
      }
    }
    else {
      local_c9 = 1;
      while (local_c9 != 0) {
        while( true ) {
          local_199 = false;
          if (local_c9 != 0) {
            local_199 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                                  (&ConvertToDynamicMessageAndStripOptions::
                                    absl_log_internal_stateful_condition_state,1.0);
          }
          if (local_199 == false) break;
          local_d0 = absl::lts_20250127::log_internal::LogEveryNSecState::counter
                               (&ConvertToDynamicMessageAndStripOptions::
                                 absl_log_internal_stateful_condition_state);
          while ((local_c9 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&local_e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x79);
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (pLVar4,(char (*) [47])"Failed to fully strip source-retention options");
            absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_e0);
            local_c9 = 0;
          }
          local_c9 = 0;
        }
        local_c9 = 0;
      }
      StripMessage(m,(vector<int,_std::allocator<int>_> *)local_50,stripped_paths);
      local_e8 = 1;
    }
    std::__cxx11::string::~string((string *)&COUNTER);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 *)((long)&serialized.field_2 + 8));
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
    if (local_e8 != 0) goto LAB_0013b74e;
  }
  local_e8 = 0;
LAB_0013b74e:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void ConvertToDynamicMessageAndStripOptions(
    Message& m, const DescriptorPool& pool,
    std::vector<std::vector<int>>* stripped_paths = nullptr) {
  // We need to look up the descriptor in the pool so that we can get a
  // descriptor which knows about any custom options that were used in the
  // .proto file.
  const Descriptor* descriptor = pool.FindMessageTypeByName(m.GetTypeName());
  std::vector<int> path;

  if (descriptor == nullptr || &pool == DescriptorPool::generated_pool()) {
    // If the pool does not contain the descriptor, then this proto file does
    // not transitively depend on descriptor.proto, in which case we know there
    // are no custom options to worry about. If we are working with the
    // generated pool, then we can still access any custom options without
    // having to resort to DynamicMessage.
    StripMessage(m, path, stripped_paths);
  } else {
    // To convert to a dynamic message, we need to serialize the original
    // descriptor and parse it back again. This can fail if the descriptor is
    // invalid, so in that case we try to handle it gracefully by stripping the
    // original descriptor without using DynamicMessage. In this situation we
    // will generally not be able to strip custom options, but we can at least
    // strip built-in options.
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    if (!m.SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!dynamic_message->ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    StripMessage(*dynamic_message, path, stripped_paths);
    if (!dynamic_message->SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!m.ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
  }
}